

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitstream.cpp
# Opt level: O0

bool slang::ast::withAfterDynamic
               (StreamingConcatenationExpression *lhs,SourceRange **dynamic,SourceRange **with)

{
  bool bVar1;
  iterator pSVar2;
  Expression *this;
  StreamingConcatenationExpression *lhs_00;
  Type *this_00;
  Expression *operand;
  StreamExpression *stream;
  iterator __end2;
  iterator __begin2;
  span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
  *local_30;
  span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
  *__range2;
  SourceRange **with_local;
  SourceRange **dynamic_local;
  StreamingConcatenationExpression *lhs_local;
  
  __range2 = (span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
              *)with;
  with_local = dynamic;
  dynamic_local = (SourceRange **)lhs;
  ___begin2 = StreamingConcatenationExpression::streams(lhs);
  local_30 = (span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
              *)&__begin2;
  __end2 = nonstd::span_lite::
           span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
           ::begin(local_30);
  pSVar2 = nonstd::span_lite::
           span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
           ::end(local_30);
  do {
    if (__end2 == pSVar2) {
      return false;
    }
    this = not_null<const_slang::ast::Expression_*>::operator*(&__end2->operand);
    if (this->kind == Streaming) {
      lhs_00 = Expression::as<slang::ast::StreamingConcatenationExpression>(this);
      bVar1 = withAfterDynamic(lhs_00,with_local,(SourceRange **)__range2);
      if (bVar1) {
        return true;
      }
    }
    else if (__end2->withExpr == (Expression *)0x0) {
      if (*with_local == (SourceRange *)0x0) {
        this_00 = not_null<const_slang::ast::Type_*>::operator->(&this->type);
        bVar1 = Type::isFixedSize(this_00);
        if (!bVar1) {
          *with_local = &this->sourceRange;
        }
      }
    }
    else {
      __range2->data_ = (pointer)&__end2->withExpr->sourceRange;
      if (*with_local != (SourceRange *)0x0) {
        return true;
      }
    }
    __end2 = __end2 + 1;
  } while( true );
}

Assistant:

static bool withAfterDynamic(const StreamingConcatenationExpression& lhs,
                             const SourceRange*& dynamic, const SourceRange*& with) {
    // The expression within the "with" is evaluated immediately before its corresponding array is
    // streamed. The first dynamically sized item without "with" constraints accept all the
    // available data. If the former appears after the latter, evaluation order has conflict.
    for (auto& stream : lhs.streams()) {
        auto& operand = *stream.operand;
        if (operand.kind == ExpressionKind::Streaming) {
            if (withAfterDynamic(operand.as<StreamingConcatenationExpression>(), dynamic, with))
                return true;
        }
        else if (stream.withExpr) {
            with = &stream.withExpr->sourceRange;
            if (dynamic)
                return true;
        }
        else if (!dynamic && !operand.type->isFixedSize()) {
            dynamic = &operand.sourceRange;
        }
    }
    return false;
}